

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int amqpvalue_get_ubyte(AMQP_VALUE value,uchar *ubyte_value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || ubyte_value == (uchar *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x12e;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_ubyte",0x12d,1,"Bad arguments: value = %p, ubyte_value = %p",value,
                ubyte_value);
    }
  }
  else if (value->type == AMQP_TYPE_UBYTE) {
    *ubyte_value = (value->value).ubyte_value;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x137;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_ubyte",0x136,1,"Value is not of type UBYTE");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_ubyte(AMQP_VALUE value, unsigned char* ubyte_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_036: [If any of the arguments is NULL then amqpvalue_get_ubyte shall return a non-zero value.] */
    if ((value == NULL) ||
        (ubyte_value == NULL))
    {
        LogError("Bad arguments: value = %p, ubyte_value = %p",
            value, ubyte_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_037: [If the type of the value is not ubyte (was not created with amqpvalue_create_ubyte), then amqpvalue_get_ubyte shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_UBYTE)
        {
            LogError("Value is not of type UBYTE");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_034: [amqpvalue_get_ubyte shall fill in the ubyte_value argument the unsigned char value stored by the AMQP value indicated by the value argument.] */
            *ubyte_value = value_data->value.ubyte_value;

            /* Codes_SRS_AMQPVALUE_01_035: [On success amqpvalue_get_ubyte shall return 0.] */
            result = 0;
        }
    }

    return result;
}